

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

BufferedFileWriter * __thiscall duckdb::WriteAheadLog::Initialize(WriteAheadLog *this)

{
  unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
  *this_00;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> _Var2;
  type pBVar3;
  FileSystem *args;
  pointer pBVar4;
  idx_t iVar5;
  FileOpenFlags FVar6;
  FileOpenFlags b;
  _Head_base<0UL,_duckdb::BufferedFileWriter_*,_false> local_48;
  FileOpenFlags local_40;
  FileOpenFlags local_30;
  
  if ((this->init_state)._M_i == INITIALIZED) {
    pBVar3 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator*(&this->writer);
    return pBVar3;
  }
  ::std::mutex::lock(&this->wal_lock);
  this_00 = &this->writer;
  if ((this->writer).
      super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
      .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl ==
      (BufferedFileWriter *)0x0) {
    args = FileSystem::Get(this->database);
    FVar6.lock = NO_LOCK;
    FVar6.compression = UNCOMPRESSED;
    FVar6._10_6_ = 0;
    FVar6.flags = 8;
    FVar6 = FileOpenFlags::operator|((FileOpenFlags *)FileFlags::FILE_FLAGS_WRITE,FVar6);
    local_40.flags = FVar6.flags;
    local_40._8_2_ = FVar6._8_2_;
    b.lock = NO_LOCK;
    b.compression = UNCOMPRESSED;
    b._10_6_ = 0;
    b.flags = 0x20;
    FVar6 = FileOpenFlags::operator|(&local_40,b);
    local_30.flags = FVar6.flags;
    local_30._8_2_ = FVar6._8_2_;
    make_uniq<duckdb::BufferedFileWriter,duckdb::FileSystem&,std::__cxx11::string&,duckdb::FileOpenFlags>
              ((duckdb *)&local_48,args,&this->wal_path,&local_30);
    _Var2._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (BufferedFileWriter *)0x0;
    _Var1._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
         .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>).
    _M_t.
    super___uniq_ptr_impl<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::BufferedFileWriter_*,_std::default_delete<duckdb::BufferedFileWriter>_>
    .super__Head_base<0UL,_duckdb::BufferedFileWriter_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (BufferedFileWriter *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
      if (local_48._M_head_impl != (BufferedFileWriter *)0x0) {
        (*((local_48._M_head_impl)->super_WriteStream)._vptr_WriteStream[2])();
      }
    }
    if ((this->init_state)._M_i == UNINITIALIZED_REQUIRES_TRUNCATE) {
      pBVar4 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
               ::operator->(this_00);
      BufferedFileWriter::Truncate(pBVar4,(this->wal_size).super___atomic_base<unsigned_long>._M_i);
    }
    pBVar4 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator->(this_00);
    iVar5 = BufferedFileWriter::GetFileSize(pBVar4);
    LOCK();
    (this->wal_size).super___atomic_base<unsigned_long>._M_i = iVar5;
    UNLOCK();
    LOCK();
    (this->init_state)._M_i = INITIALIZED;
    UNLOCK();
  }
  pBVar3 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
           ::operator*(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)&this->wal_lock);
  return pBVar3;
}

Assistant:

BufferedFileWriter &WriteAheadLog::Initialize() {
	if (Initialized()) {
		return *writer;
	}
	lock_guard<mutex> lock(wal_lock);
	if (!writer) {
		writer = make_uniq<BufferedFileWriter>(FileSystem::Get(database), wal_path,
		                                       FileFlags::FILE_FLAGS_WRITE | FileFlags::FILE_FLAGS_FILE_CREATE |
		                                           FileFlags::FILE_FLAGS_APPEND);
		if (init_state == WALInitState::UNINITIALIZED_REQUIRES_TRUNCATE) {
			writer->Truncate(wal_size);
		}
		wal_size = writer->GetFileSize();
		init_state = WALInitState::INITIALIZED;
	}
	return *writer;
}